

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O1

void duckdb::AggregateExecutor::Finalize<duckdb::KahanAvgState,double,duckdb::KahanAverageOperation>
               (Vector *states,AggregateInputData *aggr_input_data,Vector *result,idx_t count,
               idx_t offset)

{
  long lVar1;
  data_ptr_t pdVar2;
  data_ptr_t pdVar3;
  idx_t iVar4;
  double dVar5;
  undefined1 auVar6 [16];
  double dVar9;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar10 [16];
  AggregateFinalizeData finalize_data;
  AggregateFinalizeData local_48;
  
  local_48.result = result;
  local_48.input = aggr_input_data;
  if (states->vector_type == CONSTANT_VECTOR) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    local_48.result_idx = 0;
    lVar1 = **(long **)states->data;
    if (lVar1 == 0) {
      AggregateFinalizeData::ReturnNull(&local_48);
    }
    else {
      auVar6._8_4_ = (int)((ulong)lVar1 >> 0x20);
      auVar6._0_8_ = lVar1;
      auVar6._12_4_ = 0x45300000;
      dVar5 = (double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0;
      dVar9 = auVar6._8_8_ - 1.9342813113834067e+25;
      auVar7._0_8_ = dVar5 + dVar9;
      auVar7._8_8_ = dVar5 + dVar9;
      auVar10 = divpd(*(undefined1 (*) [16])(*(long **)states->data + 1),auVar7);
      *(double *)result->data = auVar10._8_8_ + auVar10._0_8_;
    }
  }
  else {
    Vector::SetVectorType(result,FLAT_VECTOR);
    pdVar2 = states->data;
    pdVar3 = result->data;
    if (count != 0) {
      iVar4 = 0;
      do {
        local_48.result_idx = offset + iVar4;
        lVar1 = **(long **)(pdVar2 + iVar4 * 8);
        if (lVar1 == 0) {
          AggregateFinalizeData::ReturnNull(&local_48);
        }
        else {
          auVar10._8_4_ = (int)((ulong)lVar1 >> 0x20);
          auVar10._0_8_ = lVar1;
          auVar10._12_4_ = 0x45300000;
          dVar5 = (double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0;
          dVar9 = auVar10._8_8_ - 1.9342813113834067e+25;
          auVar8._0_8_ = dVar5 + dVar9;
          auVar8._8_8_ = dVar5 + dVar9;
          auVar10 = divpd(*(undefined1 (*) [16])(*(long **)(pdVar2 + iVar4 * 8) + 1),auVar8);
          *(double *)(pdVar3 + iVar4 * 8 + offset * 8) = auVar10._8_8_ + auVar10._0_8_;
        }
        iVar4 = iVar4 + 1;
      } while (count != iVar4);
    }
  }
  return;
}

Assistant:

static void Finalize(Vector &states, AggregateInputData &aggr_input_data, Vector &result, idx_t count,
	                     idx_t offset) {
		if (states.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);

			auto sdata = ConstantVector::GetData<STATE_TYPE *>(states);
			auto rdata = ConstantVector::GetData<RESULT_TYPE>(result);
			AggregateFinalizeData finalize_data(result, aggr_input_data);
			OP::template Finalize<RESULT_TYPE, STATE_TYPE>(**sdata, *rdata, finalize_data);
		} else {
			D_ASSERT(states.GetVectorType() == VectorType::FLAT_VECTOR);
			result.SetVectorType(VectorType::FLAT_VECTOR);

			auto sdata = FlatVector::GetData<STATE_TYPE *>(states);
			auto rdata = FlatVector::GetData<RESULT_TYPE>(result);
			AggregateFinalizeData finalize_data(result, aggr_input_data);
			for (idx_t i = 0; i < count; i++) {
				finalize_data.result_idx = i + offset;
				OP::template Finalize<RESULT_TYPE, STATE_TYPE>(*sdata[i], rdata[finalize_data.result_idx],
				                                               finalize_data);
			}
		}
	}